

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

void __thiscall icu_63::UVector::setElementAt(UVector *this,void *obj,int32_t index)

{
  int32_t index_local;
  void *obj_local;
  UVector *this_local;
  
  if ((-1 < index) && (index < this->count)) {
    if ((this->elements[index].pointer != (void *)0x0) && (this->deleter != (UObjectDeleter *)0x0))
    {
      (*this->deleter)(this->elements[index].pointer);
    }
    this->elements[index].pointer = obj;
  }
  return;
}

Assistant:

void UVector::setElementAt(void* obj, int32_t index) {
    if (0 <= index && index < count) {
        if (elements[index].pointer != 0 && deleter != 0) {
            (*deleter)(elements[index].pointer);
        }
        elements[index].pointer = obj;
    }
    /* else index out of range */
}